

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

Bool NeedReparseTagDecls(TidyDocImpl *doc,TidyOptionValue *current,TidyOptionValue *new,
                        uint *changedUserTags)

{
  TidyOptionId TVar1;
  Bool BVar2;
  uint uVar3;
  Bool BVar4;
  ulong uVar5;
  TidyOptionType *pTVar6;
  
  *(undefined4 *)new = 0;
  uVar5 = 0;
  pTVar6 = &option_defs[0].type;
  BVar4 = no;
  do {
    TVar1 = ((TidyOptionImpl *)(pTVar6 + -4))->id;
    if (uVar5 != TVar1) {
      __assert_fail("ixVal == (uint) option->id",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/config.c"
                    ,0x243,
                    "Bool NeedReparseTagDecls(TidyDocImpl *, const TidyOptionValue *, const TidyOptionValue *, uint *)"
                   );
    }
    if ((int)TVar1 < 0x27) {
      if (TVar1 == TidyBlockTags) {
        BVar2 = OptionValueIdentical
                          ((TidyOptionImpl *)(ulong)*pTVar6,(TidyOptionValue *)doc,current);
        if (BVar2 == no) {
          uVar3 = 4;
LAB_001547f9:
          *(uint *)new = *(uint *)new | uVar3;
          BVar4 = yes;
        }
      }
      else if (TVar1 == TidyEmptyTags) {
        BVar2 = OptionValueIdentical
                          ((TidyOptionImpl *)(ulong)*pTVar6,(TidyOptionValue *)doc,current);
        if (BVar2 == no) {
          uVar3 = 1;
          goto LAB_001547f9;
        }
      }
    }
    else if (TVar1 == TidyPreTags) {
      BVar2 = OptionValueIdentical((TidyOptionImpl *)(ulong)*pTVar6,(TidyOptionValue *)doc,current);
      if (BVar2 == no) {
        uVar3 = 8;
        goto LAB_001547f9;
      }
    }
    else if (TVar1 == TidyInlineTags) {
      BVar2 = OptionValueIdentical((TidyOptionImpl *)(ulong)*pTVar6,(TidyOptionValue *)doc,current);
      if (BVar2 == no) {
        uVar3 = 2;
        goto LAB_001547f9;
      }
    }
    uVar5 = uVar5 + 1;
    doc = (TidyDocImpl *)((long)doc + 8);
    current = current + 1;
    pTVar6 = pTVar6 + 0xe;
    if (uVar5 == 0x68) {
      return BVar4;
    }
  } while( true );
}

Assistant:

static Bool NeedReparseTagDecls( TidyDocImpl* doc,
                                 const TidyOptionValue* current,
                                 const TidyOptionValue* new,
                                 uint *changedUserTags )
{
    Bool ret = no;
    uint ixVal;
    const TidyOptionImpl* option = option_defs;
    *changedUserTags = tagtype_null;

    for ( ixVal=0; ixVal < N_TIDY_OPTIONS; ++option, ++ixVal )
    {
        assert( ixVal == (uint) option->id );
        switch (option->id)
        {
#define TEST_USERTAGS(USERTAGOPTION,USERTAGTYPE) \
        case USERTAGOPTION: \
            if (!OptionValueIdentical(option,&current[ixVal],&new[ixVal])) \
            { \
                *changedUserTags |= USERTAGTYPE; \
                ret = yes; \
            } \
            break
            TEST_USERTAGS(TidyInlineTags,tagtype_inline);
            TEST_USERTAGS(TidyBlockTags,tagtype_block);
            TEST_USERTAGS(TidyEmptyTags,tagtype_empty);
            TEST_USERTAGS(TidyPreTags,tagtype_pre);
        default:
            break;
        }
    }
    return ret;
}